

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobalObject.cpp
# Opt level: O3

BOOL __thiscall
Js::GlobalObject::SetExistingProperty
          (GlobalObject *this,PropertyId propertyId,Var value,PropertyValueInfo *info,
          BOOL *setAttempted)

{
  PropertyQueryFlags PVar1;
  BOOL BVar2;
  int iVar3;
  RecyclableObject *pRVar4;
  HostObjectBase *pHVar5;
  bool bVar6;
  
  PVar1 = DynamicObject::HasPropertyQuery((DynamicObject *)this,propertyId,(PropertyValueInfo *)0x0)
  ;
  bVar6 = PVar1 != Property_Found;
  pRVar4 = RecyclableObject::GetPrototype((RecyclableObject *)this);
  BVar2 = JavascriptOperators::HasProperty(pRVar4,propertyId);
  *setAttempted = 1;
  pRVar4 = (this->directHostObject).ptr;
  if ((BVar2 == 0 && bVar6) && pRVar4 != (RecyclableObject *)0x0) {
    iVar3 = (*(pRVar4->super_FinalizableObject).super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[0xb])(pRVar4,(ulong)(uint)propertyId,0);
    if (iVar3 == 1) {
      pRVar4 = (this->directHostObject).ptr;
      iVar3 = (*(pRVar4->super_FinalizableObject).super_IRecyclerVisitedObject.
                _vptr_IRecyclerVisitedObject[0x17])(pRVar4,(ulong)(uint)propertyId,value,0,info);
      if (iVar3 != 0) {
        return 1;
      }
      goto LAB_00b4de80;
    }
    pHVar5 = (this->super_RootObjectBase).hostObject.ptr;
    if (pHVar5 == (HostObjectBase *)0x0) goto LAB_00b4de80;
  }
  else {
    pHVar5 = (this->super_RootObjectBase).hostObject.ptr;
    if (pHVar5 == (HostObjectBase *)0x0 || (BVar2 != 0 || !bVar6)) {
      if (BVar2 != 0 || !bVar6) {
        BVar2 = DynamicObject::SetProperty
                          ((DynamicObject *)this,propertyId,value,PropertyOperation_None,info);
        return BVar2;
      }
      goto LAB_00b4de80;
    }
  }
  iVar3 = (**(code **)(*(long *)pHVar5 + 0x58))(pHVar5,propertyId,0);
  if (iVar3 == 1) {
    pHVar5 = (this->super_RootObjectBase).hostObject.ptr;
    BVar2 = (**(code **)(*(long *)pHVar5 + 0xb8))(pHVar5,propertyId,value,0,0);
    return BVar2;
  }
LAB_00b4de80:
  *setAttempted = 0;
  return 0;
}

Assistant:

BOOL GlobalObject::SetExistingProperty(PropertyId propertyId, Var value, PropertyValueInfo* info, BOOL *setAttempted)
    {
        BOOL hasOwnProperty = JavascriptConversion::PropertyQueryFlagsToBoolean(DynamicObject::HasPropertyQuery(propertyId, nullptr /*info*/));
        BOOL hasProperty = JavascriptOperators::HasProperty(this->GetPrototype(), propertyId);
        *setAttempted = TRUE;

        if (this->directHostObject &&
            !hasOwnProperty &&
            !hasProperty &&
            this->directHostObject->HasProperty(propertyId))
        {
            // directHostObject->HasProperty returns true for things in global collections, however, they are not able to be set.
            // When we call SetProperty we'll return FALSE which means fall back to GlobalObject::SetProperty and shadow our collection
            // object rather than failing the set altogether. See bug Windows Out Of Band Releases 1144780 and linked bugs for details.
            if (this->directHostObject->SetProperty(propertyId, value, PropertyOperation_None, info))
            {
                return TRUE;
            }
        }
        else
            if (this->hostObject &&
                // Consider to revert to the commented line and ignore the prototype chain when direct host is on by default in IE9 mode
                !hasOwnProperty &&
                !hasProperty &&
                this->hostObject->HasProperty(propertyId))
            {
                return this->hostObject->SetProperty(propertyId, value, PropertyOperation_None, NULL);
            }

        if (hasOwnProperty || hasProperty)
        {
            return DynamicObject::SetProperty(propertyId, value, PropertyOperation_None, info);
        }

        *setAttempted = FALSE;
        return FALSE;
    }